

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O2

int cuddSymmSiftingConv(DdManager *table,int lower,int upper)

{
  size_t __size;
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  DdHalfWord DVar5;
  int *piVar6;
  void *__base;
  ulong uVar7;
  long lVar8;
  DdNode *pDVar9;
  DdNode *moves;
  DdNode *pDVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  DdHalfWord x;
  DdHalfWord y;
  uint uVar16;
  DdNode *pDVar17;
  bool bVar18;
  uint local_3c;
  int symvars;
  int symgroups;
  
  local_3c = table->keys - table->isolated;
  uVar11 = table->size;
  __size = (long)(int)uVar11 * 4;
  piVar6 = (int *)malloc(__size);
  entry = piVar6;
  if (piVar6 == (int *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
    __base = (void *)0x0;
    goto LAB_0062c468;
  }
  __base = malloc(__size);
  if (__base == (void *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    uVar7 = 0;
    uVar13 = 0;
    if (0 < (int)uVar11) {
      uVar13 = (ulong)uVar11;
    }
    for (; uVar13 != uVar7; uVar7 = uVar7 + 1) {
      piVar6[uVar7] = table->subtables[table->perm[uVar7]].keys;
      *(int *)((long)__base + uVar7 * 4) = (int)uVar7;
    }
    qsort(__base,(long)(int)uVar11,4,ddSymmUniqueCompare);
    lVar8 = (long)lower;
    lVar14 = lVar8 * 0x38 + 0x1c;
    for (; lVar8 <= upper; lVar8 = lVar8 + 1) {
      *(int *)((long)&table->subtables->nodelist + lVar14) = (int)lVar8;
      lVar14 = lVar14 + 0x38;
    }
    lVar8 = 0;
    while( true ) {
      iVar2 = table->siftMaxVar;
      if (table->size < table->siftMaxVar) {
        iVar2 = table->size;
      }
      if ((iVar2 <= lVar8) || (table->siftMaxSwap <= ddTotalNumberSwapping)) goto LAB_0062be93;
      uVar11 = table->perm[*(int *)((long)__base + lVar8 * 4)];
      if ((((int)uVar11 <= upper && lower <= (int)uVar11) &&
          (table->subtables[(int)uVar11].next == uVar11)) &&
         (iVar2 = ddSymmSiftingAux(table,uVar11,lower,upper), iVar2 == 0)) break;
      lVar8 = lVar8 + 1;
    }
  }
  goto LAB_0062c44a;
LAB_0062be93:
  piVar6 = entry;
  uVar11 = table->keys - table->isolated;
  if (local_3c <= uVar11) {
    ddSymmSummary(table,lower,upper,&symvars,&symgroups);
    free(__base);
    if (entry != (int *)0x0) {
      free(entry);
      entry = (int *)0x0;
    }
    return symvars + 1;
  }
  uVar7 = 0;
  uVar12 = lower;
  while ((int)uVar12 <= upper) {
    do {
      uVar16 = uVar12;
      uVar12 = table->subtables[(int)uVar16].next;
    } while (uVar16 < uVar12);
    iVar2 = table->invperm[(int)uVar16];
    piVar6[iVar2] = table->subtables[(int)uVar16].keys;
    *(int *)((long)__base + uVar7 * 4) = iVar2;
    uVar7 = uVar7 + 1;
    uVar12 = uVar16 + 1;
  }
  qsort(__base,uVar7 & 0xffffffff,4,ddSymmUniqueCompare);
  lVar8 = 0;
  while( true ) {
    iVar2 = table->siftMaxVar;
    if ((int)uVar7 < table->siftMaxVar) {
      iVar2 = (int)uVar7;
    }
    local_3c = uVar11;
    if ((iVar2 <= lVar8) || (table->siftMaxSwap <= ddTotalNumberSwapping)) goto LAB_0062be93;
    uVar12 = table->perm[*(int *)((long)__base + lVar8 * 4)];
    uVar16 = table->subtables[(int)uVar12].next;
    if (uVar16 <= uVar12) break;
LAB_0062c381:
    lVar8 = lVar8 + 1;
  }
  iVar2 = table->keys - table->isolated;
  if (uVar12 == lower) {
    pDVar9 = (DdNode *)ddSymmSiftingDown(table,lower,upper);
    if (pDVar9 == (DdNode *)0x0) goto LAB_0062c381;
    if (pDVar9 == (DdNode *)0x1) goto LAB_0062c44a;
    y = pDVar9->ref;
    uVar12 = y;
    do {
      uVar15 = uVar12;
      uVar12 = table->subtables[(int)uVar15].next;
    } while (uVar15 < uVar12);
    if (lower - uVar16 != uVar15 - y) {
      iVar2 = table->keys - table->isolated;
LAB_0062c2ed:
      pDVar10 = (DdNode *)ddSymmSiftingUp(table,y,lower);
      moves = pDVar10;
      goto LAB_0062c31a;
    }
    iVar2 = ddSymmSiftingBackward(table,(Move *)pDVar9,iVar2);
    moves = (DdNode *)0x0;
LAB_0062c31f:
    if (iVar2 != 0) {
      while (pDVar9 != (DdNode *)0x0) {
        pDVar10 = (pDVar9->type).kids.T;
        pDVar9->ref = 0;
        pDVar9->next = table->nextFree;
        table->nextFree = pDVar9;
        pDVar9 = pDVar10;
      }
      while (moves != (DdNode *)0x0) {
        pDVar9 = (moves->type).kids.T;
        moves->ref = 0;
        moves->next = table->nextFree;
        table->nextFree = moves;
        moves = pDVar9;
      }
      goto LAB_0062c381;
    }
  }
  else {
    iVar3 = cuddNextHigh(table,uVar12);
    if (upper < iVar3) {
      do {
        uVar16 = table->subtables[(int)uVar12].next;
        bVar18 = uVar12 < uVar16;
        iVar3 = uVar12 - uVar16;
        uVar12 = uVar16;
      } while (bVar18);
      if ((uVar16 == lower) ||
         (moves = (DdNode *)ddSymmSiftingUp(table,uVar16,lower), moves == (DdNode *)0x0))
      goto LAB_0062c381;
      if (moves != (DdNode *)0x1) {
        uVar16 = moves->index;
        if (iVar3 == uVar16 - table->subtables[(int)uVar16].next) {
          iVar2 = ddSymmSiftingBackward(table,(Move *)moves,iVar2);
          pDVar9 = (DdNode *)0x0;
          goto LAB_0062c31f;
        }
        iVar2 = table->keys - table->isolated;
LAB_0062c30a:
        pDVar10 = (DdNode *)ddSymmSiftingDown(table,uVar16,upper);
        pDVar9 = pDVar10;
LAB_0062c31a:
        iVar2 = ddSymmSiftingBackward(table,(Move *)pDVar10,iVar2);
        goto LAB_0062c31f;
      }
      goto LAB_0062c44a;
    }
    if ((int)(uVar12 - lower) <= (int)(upper - uVar12)) {
      uVar12 = table->subtables[(int)uVar12].next;
      moves = (DdNode *)ddSymmSiftingUp(table,uVar12,lower);
      if (moves == (DdNode *)0x0) {
        uVar16 = uVar12;
        do {
          x = uVar16;
          uVar16 = table->subtables[(int)x].next;
        } while (x < uVar16);
      }
      else {
        if (moves == (DdNode *)0x1) goto LAB_0062c44a;
        x = moves->index;
        uVar12 = table->subtables[(int)x].next;
      }
      pDVar10 = (DdNode *)ddSymmSiftingDown(table,x,upper);
      if (pDVar10 == (DdNode *)0x0) {
        y = table->subtables[(int)x].next;
        DVar5 = x;
      }
      else {
        if (pDVar10 == (DdNode *)0x1) goto LAB_0062c41e;
        y = pDVar10->ref;
        uVar16 = y;
        do {
          DVar5 = uVar16;
          uVar16 = table->subtables[(int)DVar5].next;
        } while (DVar5 < uVar16);
      }
      pDVar9 = pDVar10;
      if (x - uVar12 != DVar5 - y) {
        while (moves != (DdNode *)0x0) {
          pDVar10 = (moves->type).kids.T;
          moves->ref = 0;
          moves->next = table->nextFree;
          table->nextFree = moves;
          moves = pDVar10;
        }
        iVar2 = table->keys - table->isolated;
        goto LAB_0062c2ed;
      }
      goto LAB_0062c31a;
    }
    pDVar9 = (DdNode *)ddSymmSiftingDown(table,uVar12,upper);
    if (pDVar9 == (DdNode *)0x0) {
      do {
        uVar15 = uVar12;
        uVar12 = table->subtables[(int)uVar15].next;
      } while (uVar15 < uVar12);
    }
    else {
      if (pDVar9 == (DdNode *)0x1) goto LAB_0062c44a;
      uVar12 = pDVar9->ref;
      uVar16 = uVar12;
      do {
        uVar15 = uVar16;
        uVar16 = table->subtables[(int)uVar15].next;
      } while (uVar15 < uVar16);
    }
    pDVar10 = (DdNode *)ddSymmSiftingUp(table,uVar12,lower);
    if (pDVar10 == (DdNode *)0x0) {
      uVar1 = uVar12;
      do {
        uVar16 = uVar1;
        uVar1 = table->subtables[(int)uVar16].next;
        uVar4 = uVar12;
      } while (uVar16 < uVar1);
LAB_0062c23a:
      moves = pDVar10;
      if (uVar15 - uVar12 == uVar16 - uVar4) goto LAB_0062c31a;
      while (pDVar9 != (DdNode *)0x0) {
        pDVar10 = (pDVar9->type).kids.T;
        pDVar9->ref = 0;
        pDVar9->next = table->nextFree;
        table->nextFree = pDVar9;
        pDVar9 = pDVar10;
      }
      iVar2 = table->keys - table->isolated;
      goto LAB_0062c30a;
    }
    if (pDVar10 != (DdNode *)0x1) {
      uVar16 = pDVar10->index;
      uVar4 = table->subtables[(int)uVar16].next;
      goto LAB_0062c23a;
    }
    moves = (DdNode *)0x1;
  }
  if ((DdNode *)0x1 < pDVar9) {
    pDVar10 = table->nextFree;
    do {
      pDVar17 = pDVar9;
      pDVar9 = (pDVar17->type).kids.T;
      pDVar17->ref = 0;
      pDVar17->next = pDVar10;
      pDVar10 = pDVar17;
    } while (pDVar9 != (DdNode *)0x0);
    table->nextFree = pDVar17;
  }
LAB_0062c41e:
  if ((DdNode *)0x1 < moves) {
    pDVar9 = table->nextFree;
    do {
      pDVar10 = moves;
      moves = (pDVar10->type).kids.T;
      pDVar10->ref = 0;
      pDVar10->next = pDVar9;
      pDVar9 = pDVar10;
    } while (moves != (DdNode *)0x0);
    table->nextFree = pDVar10;
  }
LAB_0062c44a:
  if (entry != (int *)0x0) {
    free(entry);
    entry = (int *)0x0;
  }
LAB_0062c468:
  free(__base);
  return 0;
}

Assistant:

int
cuddSymmSiftingConv(
  DdManager * table,
  int  lower,
  int  upper)
{
    int         i;
    int         *var;
    int         size;
    int         x;
    int         result;
    int         symvars;
    int         symgroups;
    int         classes;
    int         initialSize;
#ifdef DD_STATS
    int         previousSize;
#endif

    initialSize = table->keys - table->isolated;

    size = table->size;

    /* Find order in which to sift variables. */
    var = NULL;
    entry = ABC_ALLOC(int,size);
    if (entry == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto ddSymmSiftingConvOutOfMem;
    }
    var = ABC_ALLOC(int,size);
    if (var == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto ddSymmSiftingConvOutOfMem;
    }

    for (i = 0; i < size; i++) {
        x = table->perm[i];
        entry[i] = table->subtables[x].keys;
        var[i] = i;
    }

    qsort((void *)var,size,sizeof(int),(DD_QSFP)ddSymmUniqueCompare);

    /* Initialize the symmetry of each subtable to itself
    ** for first pass of converging symmetric sifting.
    */
    for (i = lower; i <= upper; i++) {
        table->subtables[i].next = i;
    }

    for (i = 0; i < ddMin(table->siftMaxVar, table->size); i++) {
        if (ddTotalNumberSwapping >= table->siftMaxSwap)
            break;
        x = table->perm[var[i]];
        if (x < lower || x > upper) continue;
        /* Only sift if not in symmetry group already. */
        if (table->subtables[x].next == (unsigned) x) {
#ifdef DD_STATS
            previousSize = table->keys - table->isolated;
#endif
            result = ddSymmSiftingAux(table,x,lower,upper);
            if (!result) goto ddSymmSiftingConvOutOfMem;
#ifdef DD_STATS
            if (table->keys < (unsigned) previousSize + table->isolated) {
                (void) fprintf(table->out,"-");
            } else if (table->keys > (unsigned) previousSize +
                       table->isolated) {
                (void) fprintf(table->out,"+");
            } else {
                (void) fprintf(table->out,"=");
            }
            fflush(table->out);
#endif
        }
    }

    /* Sifting now until convergence. */
    while ((unsigned) initialSize > table->keys - table->isolated) {
        initialSize = table->keys - table->isolated;
#ifdef DD_STATS
        (void) fprintf(table->out,"\n");
#endif
        /* Here we consider only one representative for each symmetry class. */
        for (x = lower, classes = 0; x <= upper; x++, classes++) {
            while ((unsigned) x < table->subtables[x].next) {
                x = table->subtables[x].next;
            }
            /* Here x is the largest index in a group.
            ** Groups consist of adjacent variables.
            ** Hence, the next increment of x will move it to a new group.
            */
            i = table->invperm[x];
            entry[i] = table->subtables[x].keys;
            var[classes] = i;
        }

        qsort((void *)var,classes,sizeof(int),(DD_QSFP)ddSymmUniqueCompare);

        /* Now sift. */
        for (i = 0; i < ddMin(table->siftMaxVar,classes); i++) {
            if (ddTotalNumberSwapping >= table->siftMaxSwap)
                break;
            x = table->perm[var[i]];
            if ((unsigned) x >= table->subtables[x].next) {
#ifdef DD_STATS
                previousSize = table->keys - table->isolated;
#endif
                result = ddSymmSiftingConvAux(table,x,lower,upper);
                if (!result ) goto ddSymmSiftingConvOutOfMem;
#ifdef DD_STATS
                if (table->keys < (unsigned) previousSize + table->isolated) {
                    (void) fprintf(table->out,"-");
                } else if (table->keys > (unsigned) previousSize +
                           table->isolated) {
                    (void) fprintf(table->out,"+");
                } else {
                    (void) fprintf(table->out,"=");
                }
                fflush(table->out);
#endif
            }
        } /* for */
    }

    ddSymmSummary(table, lower, upper, &symvars, &symgroups);

#ifdef DD_STATS
    (void) fprintf(table->out, "\n#:S_SIFTING %8d: symmetric variables\n",
                   symvars);
    (void) fprintf(table->out, "#:G_SIFTING %8d: symmetric groups",
                   symgroups);
#endif

    ABC_FREE(var);
    ABC_FREE(entry);

    return(1+symvars);

ddSymmSiftingConvOutOfMem:

    if (entry != NULL) ABC_FREE(entry);
    if (var != NULL) ABC_FREE(var);

    return(0);

}